

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddMultisigSign
          (ElementsTransactionApi *this,string *tx_hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          AddressType address_type,Script *witness_script,Script *redeem_script,bool clear_stack)

{
  uint uVar1;
  ConfidentialTransactionController *in_RDI;
  string *in_stack_00000018;
  byte in_stack_00000020;
  string result;
  bool in_stack_00000137;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000138;
  uint32_t in_stack_00000144;
  Txid *in_stack_00000148;
  string *in_stack_00000150;
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000158;
  AddressType in_stack_00000170;
  Script *in_stack_00000178;
  Script *in_stack_00000180;
  _func_ConfidentialTransactionController_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string local_60 [39];
  byte local_39;
  
  local_39 = in_stack_00000020 & 1;
  std::function<cfd::ConfidentialTransactionController(std::__cxx11::string_const&)>::
  function<cfd::ConfidentialTransactionController(&)(std::__cxx11::string_const&),void>
            ((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  uVar1 = local_39 & 1;
  TransactionApiBase::AddMultisigSign<cfd::ConfidentialTransactionController>
            (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000144,
             in_stack_00000138,in_stack_00000170,in_stack_00000178,in_stack_00000180,
             in_stack_00000137);
  std::
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x58e9d2);
  ConfidentialTransactionController::ConfidentialTransactionController
            ((ConfidentialTransactionController *)CONCAT44(in_stack_ffffffffffffff44,uVar1),
             in_stack_00000018);
  std::__cxx11::string::~string(local_60);
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddMultisigSign(
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script redeem_script,
    bool clear_stack) {
  std::string result =
      TransactionApiBase::AddMultisigSign<ConfidentialTransactionController>(
          CreateController, tx_hex, txid, vout, sign_list, address_type,
          witness_script, redeem_script, clear_stack);
  return ConfidentialTransactionController(result);
}